

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdi::ControlContainer::removeButtonsFromMenuBar(ControlContainer *this,QMenuBar *menuBar)

{
  QPointer<QMenuBar> *this_00;
  QPointer<QMdiSubWindow> *this_01;
  QPointer<QWidget> *pQVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  QObject *pQVar5;
  QWidget *pQVar6;
  QWidgetPrivate *pQVar7;
  QWidget *pQVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (menuBar != (QMenuBar *)0x0) {
    pDVar2 = (this->m_menuBar).wp.d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this->m_menuBar).wp.value;
    }
    if (pQVar5 != (QObject *)menuBar) {
      QWeakPointer<QObject>::assign<QObject>(&(this->previousRight).wp,(QObject *)0x0);
      QWeakPointer<QObject>::assign<QObject>(&(this->previousLeft).wp,(QObject *)0x0);
      QWeakPointer<QObject>::assign<QObject>(&(this->m_menuBar).wp,(QObject *)menuBar);
    }
  }
  this_00 = &this->m_menuBar;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar3) {
    this_01 = &this->mdiChild;
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_01);
    if (bVar3) {
      pQVar6 = QWidget::window((QWidget *)(this->mdiChild).wp.value);
      pQVar7 = qt_widget_private(pQVar6);
      if (((pQVar7->data).field_0x12 & 4) == 0) {
        bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->m_controllerWidget);
        if (bVar3) {
          pQVar6 = QMenuBar::cornerWidget((QMenuBar *)(this->m_menuBar).wp.value,TopRightCorner);
          pDVar2 = (this->m_controllerWidget).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar8 = (QWidget *)0x0;
          }
          else {
            pQVar8 = (QWidget *)(this->m_controllerWidget).wp.value;
          }
          if (pQVar8 == pQVar6) {
            pQVar1 = &this->previousRight;
            pDVar2 = (this->previousRight).wp.d;
            if (((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) ||
               (pQVar5 = (this->previousRight).wp.value, pQVar5 == (QObject *)0x0)) {
LAB_00415e4f:
              pQVar5 = (QObject *)0x0;
            }
            else {
              lVar9 = (**(code **)(*(long *)pQVar5 + 8))();
              if (lVar9 == 0) goto LAB_00415e4f;
              (*(code *)**(undefined8 **)pQVar5)(pQVar5);
              pcVar10 = (char *)QMetaObject::className();
              pcVar11 = (char *)QMetaObject::className();
              iVar4 = strcmp(pcVar10,pcVar11);
              if (iVar4 != 0) goto LAB_00415e4f;
              bVar3 = QPointer::operator_cast_to_bool((QPointer *)(pQVar5 + 0x38));
              if (bVar3) {
                bVar3 = QWidget::isMaximized(*(QWidget **)(pQVar5 + 0x40));
                if (!bVar3) goto LAB_00416159;
                lVar9 = *(long *)(pQVar5 + 0x38);
                if ((lVar9 == 0) || (*(int *)(lVar9 + 4) == 0)) goto LAB_00415e4f;
                pQVar5 = *(QObject **)(pQVar5 + 0x40);
              }
              else {
LAB_00416159:
                pQVar5 = (QObject *)0x0;
                QWeakPointer<QObject>::assign<QObject>(&pQVar1->wp,(QObject *)0x0);
              }
            }
            pDVar2 = (this_00->wp).d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar12 = (QObject *)0x0;
            }
            else {
              pQVar12 = (this->m_menuBar).wp.value;
            }
            pDVar2 = (pQVar1->wp).d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar6 = (QWidget *)0x0;
            }
            else {
              pQVar6 = (QWidget *)(this->previousRight).wp.value;
            }
            QMenuBar::setCornerWidget((QMenuBar *)pQVar12,pQVar6,TopRightCorner);
            bVar3 = QPointer::operator_cast_to_bool((QPointer *)pQVar1);
            if (bVar3) {
              QWidget::show((QWidget *)(this->previousRight).wp.value);
              QWeakPointer<QObject>::assign<QObject>(&pQVar1->wp,(QObject *)0x0);
            }
          }
          else {
            pQVar5 = (QObject *)0x0;
          }
          QWidget::hide((QWidget *)(this->m_controllerWidget).wp.value);
          QWidget::setParent((QWidget *)(this->m_controllerWidget).wp.value,(QWidget *)0x0);
        }
        else {
          pQVar5 = (QObject *)0x0;
        }
        bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this->m_menuLabel);
        if (bVar3) {
          pQVar6 = (QWidget *)0x0;
          pQVar8 = QMenuBar::cornerWidget((QMenuBar *)(this->m_menuBar).wp.value,TopLeftCorner);
          pDVar2 = (this->m_menuLabel).wp.d;
          if (pDVar2 != (Data *)0x0) {
            if (*(int *)(pDVar2 + 4) == 0) {
              pQVar6 = (QWidget *)0x0;
            }
            else {
              pQVar6 = (QWidget *)(this->m_menuLabel).wp.value;
            }
          }
          if (pQVar6 == pQVar8) {
            pQVar1 = &this->previousLeft;
            pDVar2 = (this->previousLeft).wp.d;
            if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
               (pQVar12 = (this->previousLeft).wp.value, pQVar12 != (QObject *)0x0)) {
              lVar9 = (**(code **)(*(long *)pQVar12 + 8))();
              if (lVar9 != 0) {
                (*(code *)**(undefined8 **)pQVar12)(pQVar12);
                pcVar10 = (char *)QMetaObject::className();
                pcVar11 = (char *)QMetaObject::className();
                iVar4 = strcmp(pcVar10,pcVar11);
                if (iVar4 == 0) {
                  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(pQVar12 + 0x48));
                  if (bVar3) {
                    bVar3 = QWidget::isMaximized(*(QWidget **)(pQVar12 + 0x50));
                    if (bVar3) {
                      if (pQVar5 == (QObject *)0x0) {
                        pDVar2 = (this_01->wp).d;
                        if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
                          pQVar5 = (QObject *)0x0;
                        }
                        else {
                          pQVar5 = (this->mdiChild).wp.value;
                        }
                      }
                      goto LAB_0041602e;
                    }
                  }
                  QWeakPointer<QObject>::assign<QObject>(&pQVar1->wp,(QObject *)0x0);
                }
              }
            }
LAB_0041602e:
            pDVar2 = (this_00->wp).d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar12 = (QObject *)0x0;
            }
            else {
              pQVar12 = (this->m_menuBar).wp.value;
            }
            pDVar2 = (pQVar1->wp).d;
            if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
              pQVar6 = (QWidget *)0x0;
            }
            else {
              pQVar6 = (QWidget *)(this->previousLeft).wp.value;
            }
            QMenuBar::setCornerWidget((QMenuBar *)pQVar12,pQVar6,TopLeftCorner);
            bVar3 = QPointer::operator_cast_to_bool((QPointer *)pQVar1);
            if (bVar3) {
              QWidget::show((QWidget *)(this->previousLeft).wp.value);
              QWeakPointer<QObject>::assign<QObject>(&pQVar1->wp,(QObject *)0x0);
            }
          }
          QWidget::hide((QWidget *)(this->m_menuLabel).wp.value);
          QWidget::setParent((QWidget *)(this->m_menuLabel).wp.value,(QWidget *)0x0);
        }
        QWidget::update((QWidget *)(this->m_menuBar).wp.value);
        if (pQVar5 != (QObject *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            QMdiSubWindowPrivate::setNewWindowTitle(*(QMdiSubWindowPrivate **)(pQVar5 + 8));
            return;
          }
          goto LAB_00416171;
        }
        bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_01);
        if (bVar3) {
          pQVar6 = QWidget::window((QWidget *)(this->mdiChild).wp.value);
          QMdiSubWindowPrivate::originalWindowTitle
                    ((QString *)&local_50,*(QMdiSubWindowPrivate **)((this->mdiChild).wp.value + 8))
          ;
          QWidget::setWindowTitle(pQVar6,(QString *)&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00416171:
  __stack_chk_fail();
}

Assistant:

void ControlContainer::removeButtonsFromMenuBar(QMenuBar *menuBar)
{
    if (menuBar && menuBar != m_menuBar) {
        // m_menubar was deleted while sub-window was maximized
        previousRight = nullptr;
        previousLeft = nullptr;
        m_menuBar = menuBar;
    }

    if (!m_menuBar || !mdiChild || qt_widget_private(mdiChild->window())->data.in_destructor)
        return;

    QMdiSubWindow *child = nullptr;
    if (m_controllerWidget) {
        QWidget *currentRight = m_menuBar->cornerWidget(Qt::TopRightCorner);
        if (currentRight == m_controllerWidget) {
            if (ControlElement<ControllerWidget> *ce = ptr<ControllerWidget>(previousRight)) {
                if (!ce->mdiChild || !ce->mdiChild->isMaximized())
                    previousRight = nullptr;
                else
                    child = ce->mdiChild;
            }
            m_menuBar->setCornerWidget(previousRight, Qt::TopRightCorner);
            if (previousRight) {
                previousRight->show();
                previousRight = nullptr;
            }
        }
        m_controllerWidget->hide();
        m_controllerWidget->setParent(nullptr);
    }
    if (m_menuLabel) {
        QWidget *currentLeft = m_menuBar->cornerWidget(Qt::TopLeftCorner);
        if (currentLeft == m_menuLabel) {
            if (ControlElement<ControlLabel> *ce = ptr<ControlLabel>(previousLeft)) {
                if (!ce->mdiChild || !ce->mdiChild->isMaximized())
                    previousLeft = nullptr;
                else if (!child)
                    child = mdiChild;
            }
            m_menuBar->setCornerWidget(previousLeft, Qt::TopLeftCorner);
            if (previousLeft) {
                previousLeft->show();
                previousLeft = nullptr;
            }
        }
        m_menuLabel->hide();
        m_menuLabel->setParent(nullptr);
    }
    m_menuBar->update();
    if (child)
        child->d_func()->setNewWindowTitle();
    else if (mdiChild)
        mdiChild->window()->setWindowTitle(mdiChild->d_func()->originalWindowTitle());
}